

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

void __thiscall Minisat::Solver::byteDRUP(Solver *this,Lit l)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  
  uVar3 = l.x + 2;
  do {
    pbVar1 = *(byte **)(this + 0x680);
    *(byte **)(this + 0x680) = pbVar1 + 1;
    *pbVar1 = (byte)uVar3 | 0x80;
    *(int *)(this + 0x678) = *(int *)(this + 0x678) + 1;
    bVar2 = 0x7f < uVar3;
    uVar3 = uVar3 >> 7;
  } while (bVar2);
  *(byte *)(*(long *)(this + 0x680) + -1) = *(byte *)(*(long *)(this + 0x680) + -1) & 0x7f;
  return;
}

Assistant:

inline void byteDRUP(Lit l)
    {
        unsigned int u = 2 * (var(l) + 1) + sign(l);
        do {
            *buf_ptr++ = (u & 0x7f) | 0x80;
            buf_len++;
            u = u >> 7;
        } while (u);
        *(buf_ptr - 1) &= 0x7f; // End marker of this unsigned number.
    }